

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O0

int testMissingMiniBatchSizeParameter(void)

{
  bool bVar1;
  NeuralNetwork *pNVar2;
  ostream *poVar3;
  Result local_130;
  set<long,_std::less<long>,_std::allocator<long>_> local_108;
  set<long,_std::less<long>,_std::allocator<long>_> local_d8;
  Result local_a8;
  undefined4 local_7c;
  undefined1 local_78 [8];
  Result res;
  undefined1 local_40 [8];
  Model m;
  
  CoreML::Specification::Model::Model((Model *)local_40);
  buildBasicUpdatableModelWithCategoricalCrossEntropyAndSoftmax((Model *)local_40);
  CoreML::Model::validate((Result *)local_78,(Model *)local_40);
  bVar1 = CoreML::Result::good((Result *)local_78);
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x36f);
    poVar3 = std::operator<<(poVar3,": error: ");
    poVar3 = std::operator<<(poVar3,"!((res).good())");
    poVar3 = std::operator<<(poVar3," was false, expected true.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    m._oneof_case_[0] = 1;
  }
  else {
    pNVar2 = CoreML::Specification::Model::mutable_neuralnetwork((Model *)local_40);
    addLearningRate<CoreML::Specification::NeuralNetwork>
              (pNVar2,kSgdOptimizer,0.699999988079071,0.0,1.0);
    CoreML::Model::validate(&local_a8,(Model *)local_40);
    CoreML::Result::operator=((Result *)local_78,&local_a8);
    CoreML::Result::~Result(&local_a8);
    bVar1 = CoreML::Result::good((Result *)local_78);
    if (bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                              );
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x376);
      poVar3 = std::operator<<(poVar3,": error: ");
      poVar3 = std::operator<<(poVar3,"!((res).good())");
      poVar3 = std::operator<<(poVar3," was false, expected true.");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      m._oneof_case_[0] = 1;
    }
    else {
      pNVar2 = CoreML::Specification::Model::mutable_neuralnetwork((Model *)local_40);
      local_d8._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      local_d8._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_d8._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_d8._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
      local_d8._M_t._M_impl._0_8_ = 0;
      local_d8._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_d8._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      std::set<long,_std::less<long>,_std::allocator<long>_>::set(&local_d8);
      addMiniBatchSize<CoreML::Specification::NeuralNetwork>
                (pNVar2,kSgdOptimizer,10,5,100,&local_d8);
      std::set<long,_std::less<long>,_std::allocator<long>_>::~set(&local_d8);
      pNVar2 = CoreML::Specification::Model::mutable_neuralnetwork((Model *)local_40);
      local_108._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      local_108._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_108._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_108._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
      local_108._M_t._M_impl._0_8_ = 0;
      local_108._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_108._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      std::set<long,_std::less<long>,_std::allocator<long>_>::set(&local_108);
      addEpochs<CoreML::Specification::NeuralNetwork>(pNVar2,100,1,100,&local_108);
      std::set<long,_std::less<long>,_std::allocator<long>_>::~set(&local_108);
      CoreML::Model::validate(&local_130,(Model *)local_40);
      CoreML::Result::operator=((Result *)local_78,&local_130);
      CoreML::Result::~Result(&local_130);
      bVar1 = CoreML::Result::good((Result *)local_78);
      if (bVar1) {
        m._oneof_case_[0] = 0;
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                                );
        poVar3 = std::operator<<(poVar3,":");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x37d);
        poVar3 = std::operator<<(poVar3,": error: ");
        poVar3 = std::operator<<(poVar3,"(res).good()");
        poVar3 = std::operator<<(poVar3," was false, expected true.");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        m._oneof_case_[0] = 1;
      }
    }
  }
  local_7c = 1;
  CoreML::Result::~Result((Result *)local_78);
  CoreML::Specification::Model::~Model((Model *)local_40);
  return m._oneof_case_[0];
}

Assistant:

int testMissingMiniBatchSizeParameter() {

    Specification::Model m;

    // basic neural network model with CCE and softmax without any updatable model parameters.
    buildBasicUpdatableModelWithCategoricalCrossEntropyAndSoftmax(m);

    // expect validation to fail due to missing updatable model parameters.
    Result res = Model::validate(m);
    ML_ASSERT_BAD(res);

    // now add an updatable model parameter.
    addLearningRate(m.mutable_neuralnetwork(), Specification::Optimizer::kSgdOptimizer, 0.7f, 0.0f, 1.0f);

    // expect validation to still fail due to missing mini batch size.
    res = Model::validate(m);
    ML_ASSERT_BAD(res);

    addMiniBatchSize(m.mutable_neuralnetwork(), Specification::Optimizer::kSgdOptimizer, 10, 5, 100, std::set<int64_t>());
    addEpochs(m.mutable_neuralnetwork(), 100, 1, 100, std::set<int64_t>());

    // expect validation to pass.
    res = Model::validate(m);
    ML_ASSERT_GOOD(res);
    return 0;
}